

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracker_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::tracker_connection::tracker_connection
          (tracker_connection *this,tracker_manager *man,tracker_request *req,io_context *ios,
          weak_ptr<libtorrent::aux::request_callback> *r)

{
  weak_ptr<libtorrent::aux::request_callback> *r_local;
  io_context *ios_local;
  tracker_request *req_local;
  tracker_manager *man_local;
  tracker_connection *this_local;
  
  timeout_handler::timeout_handler(&this->super_timeout_handler,ios);
  (this->super_timeout_handler)._vptr_timeout_handler =
       (_func_int **)&PTR___cxa_pure_virtual_00b8ce60;
  tracker_request::tracker_request(&this->m_req,req);
  ::std::weak_ptr<libtorrent::aux::request_callback>::weak_ptr(&this->m_requester,r);
  this->m_man = man;
  return;
}

Assistant:

tracker_connection::tracker_connection(
		tracker_manager& man
		, tracker_request req
		, io_context& ios
		, std::weak_ptr<request_callback> r)
		: timeout_handler(ios)
		, m_req(std::move(req))
		, m_requester(std::move(r))
		, m_man(man)
	{}